

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::AttachComments
          (LocationRecorder *this,string *leading,string *trailing,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detached_comments)

{
  uint uVar1;
  string *psVar2;
  string *psVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_RBX;
  Arena *arena;
  pointer __pos;
  Location *pLVar4;
  ulong uVar5;
  string *unaff_R15;
  
  pLVar4 = this->location_;
  uVar1 = *(uint *)&pLVar4->field_0;
  if ((uVar1 & 1) == 0) {
    if ((uVar1 & 2) != 0) goto LAB_001ce3e7;
    if (leading->_M_string_length == 0) goto LAB_001ce355;
    (pLVar4->field_0)._impl_._has_bits_.has_bits_[0] = uVar1 | 1;
    leading = (string *)(pLVar4->super_Message).super_MessageLite._internal_metadata_.ptr_;
    unaff_RBX = detached_comments;
    unaff_R15 = trailing;
    if (((ulong)leading & 1) != 0) goto LAB_001ce3f1;
  }
  else {
    AttachComments();
LAB_001ce3e7:
    pLVar4 = (Location *)&stack0xffffffffffffffd0;
    AttachComments();
LAB_001ce3f1:
    leading = *(string **)((ulong)leading & 0xfffffffffffffffe);
    detached_comments = unaff_RBX;
    trailing = unaff_R15;
  }
  psVar2 = internal::ArenaStringPtr::Mutable_abi_cxx11_
                     (&(pLVar4->field_0)._impl_.leading_comments_,(Arena *)leading);
  std::__cxx11::string::swap((string *)psVar2);
LAB_001ce355:
  if (trailing->_M_string_length != 0) {
    pLVar4 = this->location_;
    (pLVar4->field_0)._impl_._has_bits_.has_bits_[0] =
         (pLVar4->field_0)._impl_._has_bits_.has_bits_[0] | 2;
    arena = (Arena *)(pLVar4->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    psVar2 = internal::ArenaStringPtr::Mutable_abi_cxx11_
                       (&(pLVar4->field_0)._impl_.trailing_comments_,arena);
    std::__cxx11::string::swap((string *)psVar2);
  }
  __pos = (detached_comments->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((detached_comments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != __pos) {
    uVar5 = 0;
    do {
      psVar3 = (string *)
               internal::RepeatedPtrFieldBase::AddString
                         (&(this->location_->field_0)._impl_.leading_detached_comments_.
                           super_RepeatedPtrFieldBase);
      std::__cxx11::string::swap(psVar3);
      uVar5 = uVar5 + 1;
      __pos = (detached_comments->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(detached_comments->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)__pos >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(detached_comments,__pos);
  return;
}

Assistant:

void Parser::LocationRecorder::AttachComments(
    std::string* leading, std::string* trailing,
    std::vector<std::string>* detached_comments) const {
  ABSL_CHECK(!location_->has_leading_comments());
  ABSL_CHECK(!location_->has_trailing_comments());

  if (!leading->empty()) {
    location_->mutable_leading_comments()->swap(*leading);
  }
  if (!trailing->empty()) {
    location_->mutable_trailing_comments()->swap(*trailing);
  }
  for (int i = 0; i < detached_comments->size(); ++i) {
    location_->add_leading_detached_comments()->swap((*detached_comments)[i]);
  }
  detached_comments->clear();
}